

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

string * __thiscall
pbrt::PowerLightSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,PowerLightSampler *this)

{
  AliasTable *in_RCX;
  
  StringPrintf<pbrt::AliasTable_const&>
            (__return_storage_ptr__,(pbrt *)"[ PowerLightSampler aliasTable: %s ]",
             (char *)&this->aliasTable,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string PowerLightSampler::ToString() const {
    return StringPrintf("[ PowerLightSampler aliasTable: %s ]", aliasTable);
}